

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

essential_t * opengv::relative_pose::eightpt(RelativeAdapterBase *adapter,Indices *indices)

{
  long *plVar1;
  int iVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *this;
  ConstTransposeReturnType other;
  Indices *in_RDX;
  long *in_RSI;
  essential_t *in_RDI;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> PVar5;
  Matrix3d Vtr;
  Matrix3d U;
  Matrix3d S;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD2;
  essential_t F;
  MatrixXd F_temp;
  Matrix<double,_9,_1,_0,_9,_1> f;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  bearingVector_t f2;
  bearingVector_t f1;
  size_t i;
  MatrixXd A;
  size_t numberCorrespondences;
  essential_t *essential;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff5e8;
  SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *in_stack_fffffffffffff5f0
  ;
  Indices *in_stack_fffffffffffff5f8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff600;
  unsigned_long *in_stack_fffffffffffff608;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff610;
  double dVar6;
  undefined8 in_stack_fffffffffffff620;
  uint computationOptions;
  MatrixType *in_stack_fffffffffffff628;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffff630;
  double *in_stack_fffffffffffff638;
  undefined1 local_88 [40];
  undefined1 local_60 [24];
  ulong local_48;
  undefined4 local_3c;
  size_t local_20;
  long *local_10;
  
  local_10 = in_RSI;
  local_20 = Indices::size(in_RDX);
  local_3c = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,(int *)in_stack_fffffffffffff600);
  for (local_48 = 0; plVar1 = local_10,
      computationOptions = (uint)((ulong)in_stack_fffffffffffff620 >> 0x20), local_48 < local_20;
      local_48 = local_48 + 1) {
    iVar2 = Indices::operator[](in_stack_fffffffffffff5f8,
                                (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    (**(code **)(*plVar1 + 0x18))(local_60,plVar1,(long)iVar2);
    plVar1 = local_10;
    iVar2 = Indices::operator[](in_stack_fffffffffffff5f8,
                                (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    (**(code **)(*plVar1 + 0x10))(local_88,plVar1,(long)iVar2);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff5f0
               ,(Index)in_stack_fffffffffffff5e8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(in_stack_fffffffffffff5e8);
    Eigen::operator*(in_stack_fffffffffffff638,(StorageBaseType *)in_stack_fffffffffffff630);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_fffffffffffff600,(Index)in_stack_fffffffffffff5f8,
               (Index)in_stack_fffffffffffff5f0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
               in_stack_fffffffffffff5f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff5e8);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff5f0
               ,(Index)in_stack_fffffffffffff5e8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(in_stack_fffffffffffff5e8);
    Eigen::operator*(in_stack_fffffffffffff638,(StorageBaseType *)in_stack_fffffffffffff630);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_fffffffffffff600,(Index)in_stack_fffffffffffff5f8,
               (Index)in_stack_fffffffffffff5f0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
               in_stack_fffffffffffff5f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff5e8);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff5f0
               ,(Index)in_stack_fffffffffffff5e8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(in_stack_fffffffffffff5e8);
    Eigen::operator*(in_stack_fffffffffffff638,(StorageBaseType *)in_stack_fffffffffffff630);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_fffffffffffff600,(Index)in_stack_fffffffffffff5f8,
               (Index)in_stack_fffffffffffff5f0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
               in_stack_fffffffffffff5f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff5e8);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,computationOptions);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_fffffffffffff5f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff600,(Index)in_stack_fffffffffffff5f8);
  Eigen::Matrix<double,9,1,0,9,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
            ((Matrix<double,_9,_1,_0,_9,_1> *)in_stack_fffffffffffff5f0,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
              *)in_stack_fffffffffffff5e8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffff610,(int *)in_stack_fffffffffffff608,
             (int *)in_stack_fffffffffffff600);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff600,
             (Index)in_stack_fffffffffffff5f8,(Index)in_stack_fffffffffffff5f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff600,(Index)in_stack_fffffffffffff5f8);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff5f0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff5e8);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff600,
             (Index)in_stack_fffffffffffff5f8,(Index)in_stack_fffffffffffff5f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff600,(Index)in_stack_fffffffffffff5f8);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff5f0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff5e8);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffff600,
             (Index)in_stack_fffffffffffff5f8,(Index)in_stack_fffffffffffff5f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffff600,(Index)in_stack_fffffffffffff5f8);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffff5f0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffff5e8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff5e8);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff5f0,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff5e8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,3,3,0,3,3>>
            (&in_stack_fffffffffffff5f0->m_matrixU,
             (EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff5e8);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,computationOptions);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb9009b);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff5f0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff5e8);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::singularValues
            (in_stack_fffffffffffff5f0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffff5f0,(Index)in_stack_fffffffffffff5e8);
  dVar6 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffff5f0,(Index)in_stack_fffffffffffff5e8,0xb9010d);
  *pSVar4 = dVar6;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::singularValues
            (in_stack_fffffffffffff5f0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffff5f0,(Index)in_stack_fffffffffffff5e8);
  dVar6 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffff5f0,(Index)in_stack_fffffffffffff5e8,0xb90171);
  *pSVar4 = dVar6;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (in_stack_fffffffffffff5f0);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff5f0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff5e8);
  this = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
          *)Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
                      (in_stack_fffffffffffff5f0);
  other = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffff5e8);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff5f0,
             (EigenBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff5e8);
  PVar5 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff5f0,
                     (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff5e8)
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(this,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other.m_matrix);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            (PVar5.m_lhs,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)PVar5.m_rhs);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)PVar5.m_lhs);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb90281);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)PVar5.m_lhs);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb9029b);
  return in_RDI;
}

Assistant:

essential_t eightpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 7);

  Eigen::MatrixXd A(numberCorrespondences,9);

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    //bearingVector_t f1 = adapter.getBearingVector1(indices[i]);
    //bearingVector_t f2 = adapter.getBearingVector2(indices[i]);
    //The eight-point essentially computes the inverse transformation, which is
    //why we invert the input here
    bearingVector_t f1 = adapter.getBearingVector2(indices[i]);
    bearingVector_t f2 = adapter.getBearingVector1(indices[i]);

    A.block<1,3>(i,0) = f2[0] * f1.transpose();
    A.block<1,3>(i,3) = f2[1] * f1.transpose();
    A.block<1,3>(i,6) = f2[2] * f1.transpose();
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      A,
      Eigen::ComputeFullU | Eigen::ComputeFullV );
  Eigen::Matrix<double,9,1> f = SVD.matrixV().col(8);

  Eigen::MatrixXd F_temp(3,3);
  F_temp.col(0) = f.block<3,1>(0,0);
  F_temp.col(1) = f.block<3,1>(3,0);
  F_temp.col(2) = f.block<3,1>(6,0);
  essential_t F = F_temp.transpose();

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD2(
      F,
      Eigen::ComputeFullU | Eigen::ComputeFullV );
  Eigen::Matrix3d S = Eigen::Matrix3d::Zero();
  S(0,0) = SVD2.singularValues()[0];
  S(1,1) = SVD2.singularValues()[1];

  Eigen::Matrix3d U = SVD2.matrixU();
  Eigen::Matrix3d Vtr = SVD2.matrixV().transpose();

  essential_t essential = U * S * Vtr;
  return essential;
}